

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

void __thiscall
dlib::matrix<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
set_size(matrix<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         *this,long rows,long cols)

{
  float *pfVar1;
  
  if ((cols == 1) && ((this->data).nr_ == rows)) {
    return;
  }
  pfVar1 = (this->data).data;
  if (pfVar1 != (float *)0x0) {
    operator_delete__(pfVar1);
  }
  pfVar1 = memory_manager_stateless_kernel_1<float>::allocate_array(&(this->data).pool,cols * rows);
  (this->data).data = pfVar1;
  (this->data).nr_ = rows;
  return;
}

Assistant:

void set_size (
            long rows,
            long cols
        )
        {
            DLIB_ASSERT( (NR == 0 || NR == rows) && ( NC == 0 || NC == cols) &&
                    rows >= 0 && cols >= 0, 
                "\tvoid matrix::set_size(rows, cols)"
                << "\n\tYou have supplied conflicting matrix dimensions"
                << "\n\trows: " << rows
                << "\n\tcols: " << cols
                << "\n\tNR:   " << NR 
                << "\n\tNC:   " << NC 
                << "\n\tthis: " << this
                );
            if (nr() != rows || nc() != cols)
                data.set_size(rows,cols);
        }